

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

void S2Builder::Graph::CanonicalizeLoopOrder
               (vector<int,_std::allocator<int>_> *min_input_ids,
               vector<int,_std::allocator<int>_> *loop)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  piVar3 = (loop->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (loop->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar4) {
    uVar6 = (long)piVar4 - (long)piVar3 >> 2;
    uVar8 = 1;
    if (1 < uVar6) {
      piVar4 = (min_input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = 0;
      bVar9 = false;
      do {
        iVar1 = piVar4[piVar3[iVar7]];
        iVar2 = piVar4[piVar3[uVar8]];
        if (iVar2 < iVar1) {
          bVar9 = true;
        }
        else if ((iVar2 != iVar1) || (!bVar9)) {
          bVar9 = false;
          iVar7 = (int)uVar8;
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      uVar8 = (ulong)(iVar7 + 1);
    }
    uVar5 = 0;
    if (uVar6 != uVar8) {
      uVar5 = uVar8;
    }
    std::_V2::__rotate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (piVar3,piVar3 + uVar5);
    return;
  }
  return;
}

Assistant:

void Graph::CanonicalizeLoopOrder(const vector<InputEdgeId>& min_input_ids,
                                  vector<EdgeId>* loop) {
  if (loop->empty()) return;
  // Find the position of the element with the highest input edge id.  If
  // there are multiple such elements together (i.e., the edge was split
  // into several pieces by snapping it to several vertices), then we choose
  // the last such position in cyclic order (this attempts to preserve the
  // original loop order even when new vertices are added).  For example, if
  // the input edge id sequence is (7, 7, 4, 5, 6, 7) then we would rotate
  // it to obtain (4, 5, 6, 7, 7, 7).

  // The reason that we put the highest-numbered edge last, rather than the
  // lowest-numbered edge first, is that S2Loop::Invert() reverses the loop
  // edge order *except* for the last edge.  For example, the loop ABCD (with
  // edges AB, BC, CD, DA) becomes DCBA (with edges DC, CB, BA, AD).  Note
  // that the last edge is the same except for its direction (DA vs. AD).
  // This has the advantage that if an undirected loop is assembled with the
  // wrong orientation and later inverted (e.g. by S2Polygon::InitOriented),
  // we still end up preserving the original cyclic vertex order.
  int pos = 0;
  bool saw_gap = false;
  for (int i = 1; i < loop->size(); ++i) {
    int cmp = min_input_ids[(*loop)[i]] - min_input_ids[(*loop)[pos]];
    if (cmp < 0) {
      saw_gap = true;
    } else if (cmp > 0 || !saw_gap) {
      pos = i;
      saw_gap = false;
    }
  }
  if (++pos == loop->size()) pos = 0;  // Convert loop end to loop start.
  std::rotate(loop->begin(), loop->begin() + pos, loop->end());
}